

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_binarymodelserialiser.cpp
# Opt level: O3

void __thiscall tst_BinaryModelSerialiser::basicSaveLoadStream(tst_BinaryModelSerialiser *this)

{
  QAbstractItemModel *a;
  QAbstractItemModel *b;
  bool bVar1;
  char cVar2;
  __atomic_base<int> _Var3;
  undefined8 *puVar4;
  QByteArray dataArray;
  QDataStream writeStream;
  BinaryModelSerialiser serialiser;
  QDataStream readStream;
  QByteArray local_c8;
  QMetaTypeInterface *local_a8 [4];
  BinaryModelSerialiser local_88 [24];
  QDataStream local_70 [32];
  QModelIndex local_50;
  QModelIndex local_38;
  
  local_a8[0] = &QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType;
  _Var3._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType.typeId.
               _q_value.super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var3._M_i = QMetaType::idHelper();
  }
  puVar4 = (undefined8 *)QTest::qData("sourceModel",_Var3._M_i);
  a = (QAbstractItemModel *)*puVar4;
  local_a8[0] = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
  _Var3._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var3._M_i = QMetaType::idHelper();
  }
  puVar4 = (undefined8 *)QTest::qData("destinationModel",_Var3._M_i);
  b = (QAbstractItemModel *)*puVar4;
  BinaryModelSerialiser::BinaryModelSerialiser(local_88,a,(QObject *)0x0);
  AbstractModelSerialiser::addRoleToSave((int)local_88);
  local_c8.d.d = (Data *)0x0;
  local_c8.d.ptr = (char *)0x0;
  local_c8.d.size = 0;
  QDataStream::QDataStream((QDataStream *)local_a8,&local_c8,2);
  bVar1 = (bool)BinaryModelSerialiser::saveModel((QDataStream *)local_88);
  cVar2 = QTest::qVerify(bVar1,"serialiser.saveModel(writeStream)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_BinaryModelSerialiser/tst_binarymodelserialiser.cpp"
                         ,0x2d);
  if (cVar2 != '\0') {
    QDataStream::QDataStream(local_70,&local_c8);
    AbstractModelSerialiser::setModel((QAbstractItemModel *)local_88);
    bVar1 = (bool)BinaryModelSerialiser::loadModel((QDataStream *)local_88);
    cVar2 = QTest::qVerify(bVar1,"serialiser.loadModel(readStream)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_BinaryModelSerialiser/tst_binarymodelserialiser.cpp"
                           ,0x30);
    if (cVar2 != '\0') {
      local_38.r = -1;
      local_38.c = -1;
      local_38.i = 0;
      local_38.m = (QAbstractItemModel *)0x0;
      local_50.r = -1;
      local_50.c = -1;
      local_50.i = 0;
      local_50.m = (QAbstractItemModel *)0x0;
      tst_SerialiserCommon::checkModelEqual
                (&this->super_tst_SerialiserCommon,a,b,&local_38,&local_50,true);
      QObject::deleteLater();
    }
    QDataStream::~QDataStream(local_70);
  }
  QDataStream::~QDataStream((QDataStream *)local_a8);
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,1,8);
    }
  }
  BinaryModelSerialiser::~BinaryModelSerialiser(local_88);
  return;
}

Assistant:

void tst_BinaryModelSerialiser::basicSaveLoadStream()
{
    QFETCH(const QAbstractItemModel *, sourceModel);
    QFETCH(QAbstractItemModel *, destinationModel);
    BinaryModelSerialiser serialiser(sourceModel, nullptr);
    serialiser.addRoleToSave(Qt::UserRole + 1);
    QByteArray dataArray;
    QDataStream writeStream(&dataArray, QIODevice::WriteOnly);
    QVERIFY(serialiser.saveModel(writeStream));
    QDataStream readStream(dataArray);
    serialiser.setModel(destinationModel);
    QVERIFY(serialiser.loadModel(readStream));
    checkModelEqual(sourceModel, destinationModel);
    destinationModel->deleteLater();
}